

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O3

void Y8950_deltat_status_reset(void *chip,UINT8 changebits)

{
  byte bVar1;
  FM_OPL *Y8950;
  
  bVar1 = ~changebits & *(byte *)((long)chip + 0x1792);
  *(byte *)((long)chip + 0x1792) = bVar1;
  if (((char)bVar1 < '\0') && ((*(byte *)((long)chip + 0x1793) & bVar1) == 0)) {
    *(byte *)((long)chip + 0x1792) = bVar1 & 0x7f;
    if (*(code **)((long)chip + 6000) != (code *)0x0) {
      (**(code **)((long)chip + 6000))(*(undefined8 *)((long)chip + 0x1778),0);
      return;
    }
  }
  return;
}

Assistant:

INLINE void OPL_STATUS_RESET(FM_OPL *OPL,int flag)
{
	/* reset status flag */
	OPL->status &=~flag;
	if((OPL->status & 0x80))
	{
		if (!(OPL->status & OPL->statusmask) )
		{
			OPL->status &= 0x7f;
			/* callback user interrupt handler (IRQ is ON to OFF) */
			if(OPL->IRQHandler) (OPL->IRQHandler)(OPL->IRQParam,0);
		}
	}
}